

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

uint32_t __thiscall cfd::core::Psbt::AddTxIn(Psbt *this,Txid *txid,uint32_t vout,uint32_t sequence)

{
  uint32_t uVar1;
  void *pvVar2;
  CfdException *pCVar3;
  int ret;
  wally_tx_input *input;
  Transaction local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txhash;
  
  pvVar2 = this->wally_psbt_pointer_;
  uVar1 = *(uint32_t *)((long)pvVar2 + 0x18);
  input = (wally_tx_input *)0x0;
  Txid::GetData((ByteData *)&local_88,txid);
  ByteData::GetBytes(&txhash,(ByteData *)&local_88);
  if (local_88.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
    operator_delete(local_88.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  ret = wally_tx_input_init_alloc
                  (txhash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)txhash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)txhash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,vout,sequence,0,0,0,&input);
  if (ret == 0) {
    ret = wally_psbt_add_input_at(pvVar2,uVar1,1,input);
    wally_tx_input_free(input);
    if (ret == 0) {
      RebuildTransaction(&local_88,this->wally_psbt_pointer_);
      Transaction::operator=(&this->base_tx_,&local_88);
      Transaction::~Transaction(&local_88);
      if (txhash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(txhash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return uVar1;
    }
    local_88.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x21e190;
    local_88.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x8a2;
    local_88.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x21c620;
    logger::log<int&>((CfdSourceLocation *)&local_88,kCfdLogLevelWarning,
                      "wally_psbt_add_input_at NG[{}]",&ret);
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_88.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)&local_88.vin_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"psbt add input error.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_88);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_88.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x21e190;
  local_88.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x89a;
  local_88.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x21c620;
  logger::log<int&>((CfdSourceLocation *)&local_88,kCfdLogLevelWarning,
                    "wally_tx_input_init_alloc NG[{}]",&ret);
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_88.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)&local_88.vin_;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"psbt alloc input error.","");
  CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_88);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t Psbt::AddTxIn(const Txid &txid, uint32_t vout, uint32_t sequence) {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  uint32_t index = static_cast<uint32_t>(psbt_pointer->num_inputs);
  struct wally_tx_input *input = nullptr;
  std::vector<uint8_t> txhash = txid.GetData().GetBytes();

  int ret = wally_tx_input_init_alloc(
      txhash.data(), txhash.size(), vout, sequence, nullptr, 0, nullptr,
      &input);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_input_init_alloc NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt alloc input error.");
  }

  ret = wally_psbt_add_input_at(
      psbt_pointer, index, WALLY_PSBT_FLAG_NON_FINAL, input);
  wally_tx_input_free(input);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_add_input_at NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt add input error.");
  }
  base_tx_ = RebuildTransaction(wally_psbt_pointer_);
  return index;
}